

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ty.hpp
# Opt level: O1

void __thiscall mir::types::PtrTy::PtrTy(PtrTy *this,SharedTyPtr *item)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_Ty).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001efe90;
  (this->item).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (item->super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (item->super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->item).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  reduce_array(this);
  return;
}

Assistant:

PtrTy(SharedTyPtr item) : item(item) {
    // reduce "to" type to array item if it's an array
    reduce_array();
  }